

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O2

bool tcu::compareThreshold(RGBA a,RGBA b,RGBA threshold)

{
  bool bVar1;
  RGBA local_c;
  
  bVar1 = true;
  if (a.m_value != b.m_value) {
    local_c = computeAbsDiff(a,b);
    bVar1 = RGBA::isBelowThreshold(&local_c,threshold);
  }
  return bVar1;
}

Assistant:

inline bool compareThreshold (RGBA a, RGBA b, RGBA threshold)
{
	if (a == b) return true;	// Quick-accept
	return computeAbsDiff(a, b).isBelowThreshold(threshold);
}